

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

int ON_FontList::CompareQuartetName(ON_Font **lhs,ON_Font **rhs)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  bool bVar3;
  int iVar4;
  wchar_t *string1;
  wchar_t *string2;
  ON_wString *pOVar5;
  ON_wString local_30;
  ON_wString local_28;
  
  iVar4 = 0;
  if (lhs != rhs) {
    if (lhs == (ON_Font **)0x0) {
      iVar4 = 1;
    }
    else if (rhs == (ON_Font **)0x0) {
      iVar4 = -1;
    }
    else {
      pOVar1 = *lhs;
      pOVar2 = *rhs;
      iVar4 = 0;
      if (((pOVar1 != pOVar2) && (iVar4 = 1, pOVar1 != (ON_Font *)0x0)) &&
         (iVar4 = -1, pOVar2 != (ON_Font *)0x0)) {
        bVar3 = ON_wString::IsNotEmpty(&pOVar1->m_loc_windows_logfont_name);
        pOVar5 = &pOVar1->m_en_windows_logfont_name;
        if (bVar3) {
          pOVar5 = &pOVar1->m_loc_windows_logfont_name;
        }
        ON_wString::ON_wString(&local_28,pOVar5);
        string1 = ON_wString::operator_cast_to_wchar_t_(&local_28);
        bVar3 = ON_wString::IsNotEmpty(&pOVar2->m_loc_windows_logfont_name);
        pOVar5 = &pOVar2->m_en_windows_logfont_name;
        if (bVar3) {
          pOVar5 = &pOVar2->m_loc_windows_logfont_name;
        }
        ON_wString::ON_wString(&local_30,pOVar5);
        string2 = ON_wString::operator_cast_to_wchar_t_(&local_30);
        iVar4 = ON_wString::CompareOrdinal(string1,string2,true);
        ON_wString::~ON_wString(&local_30);
        ON_wString::~ON_wString(&local_28);
      }
    }
  }
  return iVar4;
}

Assistant:

int ON_FontList::CompareQuartetName(ON_Font const* const* lhs, ON_Font const* const* rhs)
{
  ON_ManagedFonts_CompareFontPointer(lhs, rhs);
  return ON_wString::CompareOrdinal(
    lhs_font->QuartetName(), 
    rhs_font->QuartetName(),
    true
  );
}